

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::MILSpec::Function::Clear(Function *this)

{
  string *psVar1;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::TypeHandler>
            (&(this->inputs_).super_RepeatedPtrFieldBase);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>
  ::clear(&(this->block_specializations_).map_);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::clear(&(this->attributes_).map_);
  psVar1 = (this->opset_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  return;
}

Assistant:

void Function::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Function)
  inputs_.Clear();
  block_specializations_.Clear();
  attributes_.Clear();
  opset_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}